

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void processMSG(UA_Server *server,UA_SecureChannel *channel,UA_UInt32 requestId,UA_ByteString *msg)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar7;
  UA_Logger p_Var8;
  UA_SecureChannel *pUVar9;
  undefined8 uVar10;
  UA_Server *pUVar11;
  UA_UInt32 UVar12;
  code *pcVar13;
  UA_Boolean UVar14;
  UA_StatusCode UVar15;
  UA_Session *session;
  ulong uVar16;
  UA_DataType *pUVar17;
  long lVar18;
  ulong uVar19;
  size_t sVar20;
  long lVar21;
  SessionEntry *pSVar22;
  UA_CreateSessionRequest *request;
  UA_DataType *pUVar23;
  UA_SessionManager *pUVar24;
  uint uVar25;
  UA_CreateSessionRequest *response;
  UA_CreateSessionRequest *response_00;
  UA_String *pUStack_240;
  size_t sStack_238;
  UA_Byte *pUStack_230;
  size_t sStack_228;
  UA_Byte *pUStack_220;
  size_t sStack_218;
  UA_Byte *pUStack_210;
  size_t sStack_208;
  UA_Byte *pUStack_200;
  size_t sStack_1f8;
  UA_Byte *pUStack_1f0;
  UA_Double UStack_1e8;
  UA_UInt32 aUStack_1e0 [2];
  undefined1 local_1d8 [16];
  size_t local_1c8;
  UA_Byte *pUStack_1c0;
  UA_UInt32 local_1b8 [2];
  UA_Byte *pUStack_1b0;
  size_t local_1a8;
  UA_Byte *pUStack_1a0;
  undefined8 local_198;
  size_t sStack_190;
  UA_Byte *local_188;
  size_t sStack_180;
  UA_Byte *pUStack_178;
  undefined1 uStack_170;
  undefined7 local_16f;
  undefined1 uStack_168;
  undefined8 uStack_167;
  size_t local_158;
  UA_Byte *pUStack_150;
  UA_NodeId local_148;
  UA_NodeId UStack_130;
  undefined8 local_118;
  UA_Double UStack_110;
  UA_DateTime local_108;
  UA_SecureChannel *local_100;
  UA_UInt16 local_f8;
  ContinuationPointList local_f0;
  UA_UInt32 local_e8;
  UA_ListOfUASubscriptions local_e0;
  UA_PublishResponseEntry *pUStack_d8;
  UA_PublishResponseEntry **local_d0;
  undefined1 local_c8 [8];
  timeval tv;
  UA_NodeId requestTypeId;
  size_t local_88;
  size_t ppos;
  UA_DataType *local_78;
  UA_Server *local_70;
  UA_UInt32 local_64;
  undefined8 local_60;
  undefined8 local_58;
  code *local_50;
  undefined8 local_48;
  size_t local_40;
  UA_DataType *local_38;
  
  request = (UA_CreateSessionRequest *)local_1d8;
  local_88 = 0;
  aUStack_1e0[0] = 0x12a529;
  aUStack_1e0[1] = 0;
  UVar15 = UA_decodeBinary(msg,&local_88,&tv.tv_usec,UA_TYPES + 0x10);
  sVar20 = local_88;
  if (UVar15 != 0) {
    return;
  }
  if (tv.tv_usec._4_4_ != 0) {
    aUStack_1e0[0] = 0x12a550;
    aUStack_1e0[1] = 0;
    deleteMembers_noInit(&tv.tv_usec,UA_TYPES + 0x10);
    tv.tv_usec = 0;
    uVar19 = 0;
    goto LAB_0012a565;
  }
  uVar19 = (ulong)(uint)requestTypeId._0_4_;
  local_70 = server;
  local_64 = requestId;
  if ((int)requestTypeId._0_4_ < 0x236) {
    if (0x1ed < (int)requestTypeId._0_4_) {
      if ((int)requestTypeId._0_4_ < 0x20f) {
        if (requestTypeId._0_4_ == 0x1ee) {
          local_50 = Service_AddReferences;
          pUVar23 = UA_TYPES + 0x86;
          local_38 = UA_TYPES + 0x8a;
        }
        else if (requestTypeId._0_4_ == 500) {
          local_50 = Service_DeleteNodes;
          pUVar23 = UA_TYPES + 0x4d;
          local_38 = UA_TYPES + 0x80;
        }
        else {
          if (requestTypeId._0_4_ != 0x1fa) goto LAB_0012a565;
          local_50 = Service_DeleteReferences;
          pUVar23 = UA_TYPES + 0x83;
          local_38 = UA_TYPES + 0x7d;
        }
      }
      else if ((int)requestTypeId._0_4_ < 0x22a) {
        if (requestTypeId._0_4_ == 0x20f) {
          local_50 = Service_Browse;
          pUVar23 = UA_TYPES + 0x96;
          local_38 = UA_TYPES + 0xa0;
        }
        else {
          if (requestTypeId._0_4_ != 0x215) goto LAB_0012a565;
          local_50 = Service_BrowseNext;
          pUVar23 = UA_TYPES + 0x5c;
          local_38 = UA_TYPES + 0x9e;
        }
      }
      else if (requestTypeId._0_4_ == 0x22a) {
        local_50 = Service_TranslateBrowsePathsToNodeIds;
        pUVar23 = UA_TYPES + 0x9f;
        local_38 = UA_TYPES + 0x8b;
      }
      else {
        if (requestTypeId._0_4_ != 0x230) goto LAB_0012a565;
        local_50 = Service_RegisterNodes;
        pUVar23 = UA_TYPES + 0x4c;
        local_38 = UA_TYPES + 0x62;
      }
      goto LAB_0012ab06;
    }
    if ((int)requestTypeId._0_4_ < 0x1d3) {
      if (requestTypeId._0_4_ == 0x1a6) {
        local_50 = Service_FindServers;
        pUVar23 = UA_TYPES + 0x75;
        local_38 = UA_TYPES + 0x91;
LAB_0012a96b:
        local_48 = (ulong)local_48._4_4_ << 0x20;
        goto LAB_0012ab0f;
      }
      if (requestTypeId._0_4_ == 0x1ac) {
        local_50 = Service_GetEndpoints;
        pUVar23 = UA_TYPES + 0x6e;
        local_38 = UA_TYPES + 0x9c;
        goto LAB_0012a96b;
      }
      if (requestTypeId._0_4_ != 0x1cd) goto LAB_0012a565;
      local_50 = Service_CreateSession;
      pUVar23 = UA_TYPES + 0x99;
      local_40 = 0x11da01;
      local_38 = UA_TYPES + 0xa1;
      local_48 = (ulong)local_48._4_4_ << 0x20;
      goto LAB_0012ab17;
    }
    if (requestTypeId._0_4_ != 0x1d3) {
      if (requestTypeId._0_4_ == 0x1d9) {
        local_50 = Service_CloseSession;
        pUVar23 = UA_TYPES + 99;
        local_38 = UA_TYPES + 0x8e;
      }
      else {
        if (requestTypeId._0_4_ != 0x1e8) goto LAB_0012a565;
        local_50 = Service_AddNodes;
        pUVar23 = UA_TYPES + 0x95;
        local_38 = UA_TYPES + 0x70;
      }
      goto LAB_0012ab06;
    }
    local_50 = Service_ActivateSession;
    pUVar23 = UA_TYPES + 0x53;
    local_38 = UA_TYPES + 0x58;
    local_48 = CONCAT44(local_48._4_4_,0x13f401);
    local_40 = 0;
    local_60 = CONCAT44(local_60._4_4_,0x13f401);
LAB_0012ab1e:
    local_58 = (ulong)local_58._4_4_ << 0x20;
  }
  else {
    if ((int)requestTypeId._0_4_ < 0x30d) {
      if ((int)requestTypeId._0_4_ < 0x2c8) {
        if (requestTypeId._0_4_ == 0x236) {
          local_50 = Service_UnregisterNodes;
          pUVar23 = UA_TYPES + 0x2a;
          local_38 = UA_TYPES + 0x69;
        }
        else if (requestTypeId._0_4_ == 0x277) {
          local_50 = Service_Read;
          pUVar23 = UA_TYPES + 0x87;
          local_38 = UA_TYPES + 0x85;
        }
        else {
          if (requestTypeId._0_4_ != 0x2a1) goto LAB_0012a565;
          local_50 = Service_Write;
          pUVar23 = UA_TYPES + 0x6a;
          local_38 = UA_TYPES + 0x5b;
        }
      }
      else if ((int)requestTypeId._0_4_ < 0x2fb) {
        if (requestTypeId._0_4_ == 0x2c8) {
          local_50 = Service_Call;
          pUVar23 = UA_TYPES + 0x30;
          local_38 = UA_TYPES + 0x7f;
        }
        else {
          if (requestTypeId._0_4_ != 0x2ef) {
LAB_0012a565:
            sVar20 = local_88;
            if (channel->connection == (UA_Connection *)0x0) {
              uVar16 = 0;
            }
            else {
              uVar16 = (ulong)(uint)channel->connection->sockfd;
            }
            aUStack_1e0[0] = 0x12a615;
            aUStack_1e0[1] = 0;
            UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SECURECHANNEL,
                        "Connection %i | SecureChannel %i | Unknown request with type identifier %i"
                        ,uVar16,(ulong)(channel->securityToken).channelId,uVar19);
            UVar15 = 0x800b0000;
            pUVar17 = UA_TYPES + 0x90;
            goto LAB_0012ab63;
          }
          local_50 = Service_CreateMonitoredItems;
          pUVar23 = UA_TYPES + 0x92;
          local_38 = UA_TYPES + 0x7e;
        }
      }
      else if (requestTypeId._0_4_ == 0x2fb) {
        local_50 = Service_ModifyMonitoredItems;
        pUVar23 = UA_TYPES + 0x73;
        local_38 = UA_TYPES + 0x84;
      }
      else {
        if (requestTypeId._0_4_ != 0x301) goto LAB_0012a565;
        local_50 = Service_SetMonitoringMode;
        pUVar23 = UA_TYPES + 0x68;
        local_38 = UA_TYPES + 0x74;
      }
LAB_0012ab06:
      local_48 = CONCAT44(local_48._4_4_,(int)CONCAT71((int7)((ulong)local_38 >> 8),1));
LAB_0012ab0f:
      local_40 = 0;
LAB_0012ab17:
      local_60 = (ulong)local_60._4_4_ << 0x20;
      goto LAB_0012ab1e;
    }
    if ((int)requestTypeId._0_4_ < 799) {
      if (requestTypeId._0_4_ == 0x30d) {
        local_50 = Service_DeleteMonitoredItems;
        pUVar23 = UA_TYPES + 0x66;
        local_38 = UA_TYPES + 0x4a;
      }
      else if (requestTypeId._0_4_ == 0x313) {
        local_50 = Service_CreateSubscription;
        pUVar23 = UA_TYPES + 0x5d;
        local_38 = UA_TYPES + 0x7a;
      }
      else {
        if (requestTypeId._0_4_ != 0x319) goto LAB_0012a565;
        local_50 = Service_ModifySubscription;
        pUVar23 = UA_TYPES + 100;
        local_38 = UA_TYPES + 0x60;
      }
      goto LAB_0012ab06;
    }
    if (0x33f < (int)requestTypeId._0_4_) {
      if (requestTypeId._0_4_ == 0x340) {
        local_50 = Service_Republish;
        pUVar23 = UA_TYPES + 0x6d;
        local_38 = UA_TYPES + 0x81;
      }
      else {
        if (requestTypeId._0_4_ != 0x34f) goto LAB_0012a565;
        local_50 = Service_DeleteSubscriptions;
        pUVar23 = UA_TYPES + 0x48;
        local_38 = UA_TYPES + 0x7b;
      }
      goto LAB_0012ab06;
    }
    if (requestTypeId._0_4_ == 799) {
      local_50 = Service_SetPublishingMode;
      pUVar23 = UA_TYPES + 0x2e;
      local_38 = UA_TYPES + 0x77;
      goto LAB_0012ab06;
    }
    if (requestTypeId._0_4_ != 0x33a) goto LAB_0012a565;
    pUVar23 = UA_TYPES + 0x6f;
    local_38 = UA_TYPES + 0x4e;
    local_48 = CONCAT44(local_48._4_4_,0x13f201);
    local_40 = 0;
    local_60 = (ulong)local_60._4_4_ << 0x20;
    local_58 = CONCAT44(local_58._4_4_,0x13f201);
    local_50 = (code *)0x0;
  }
  lVar18 = -(ulong)(pUVar23->memSize + 0xf & 0xfffffff0);
  request = (UA_CreateSessionRequest *)(local_1d8 + lVar18);
  *(undefined8 *)((long)aUStack_1e0 + lVar18) = 0x12ab4b;
  UVar15 = UA_decodeBinary(msg,&local_88,request,pUVar23);
  pUVar17 = local_38;
  requestId = local_64;
  if (UVar15 != 0) {
LAB_0012ab63:
    *(undefined8 *)&request[-1].maxResponseMessageSize = 0x12ab68;
    sendError(channel,msg,sVar20,pUVar17,requestId,UVar15);
    return;
  }
  uVar6 = local_38->memSize;
  response = (UA_CreateSessionRequest *)((long)request - (ulong)(uVar6 + 0xf & 0xfffffff0));
  local_78 = pUVar23;
  *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12ab9e;
  memset(response,0,(ulong)uVar6);
  pUVar11 = local_70;
  if ((char)local_40 == '\0') {
    local_40 = sVar20;
    pSVar22 = (SessionEntry *)&channel->sessions;
    ppos = (size_t)response;
    do {
      pSVar22 = (pSVar22->pointers).le_next;
      if (pSVar22 == (SessionEntry *)0x0) goto LAB_0012abeb;
      session = pSVar22->session;
      *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12abe2;
      UVar14 = UA_NodeId_equal(&session->authenticationToken,(UA_NodeId *)request);
    } while (!UVar14);
    if (session == (UA_Session *)0x0) {
LAB_0012abeb:
      pUVar24 = &local_70->sessionManager;
      *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12abfb;
      session = UA_SessionManager_getSession(pUVar24,(UA_NodeId *)request);
    }
    pUVar17 = local_38;
    sVar20 = local_40;
    UVar12 = local_64;
    pUVar11 = local_70;
    pUVar23 = local_78;
    response_00 = (UA_CreateSessionRequest *)ppos;
    if ((char)local_60 == '\0') {
      if (session == (UA_Session *)0x0) {
        if ((char)local_48 != '\0') {
          p_Var8 = (local_70->config).logger;
          if (channel->connection == (UA_Connection *)0x0) {
            uVar19 = 0;
          }
          else {
            uVar19 = (ulong)(uint)channel->connection->sockfd;
          }
          uVar25 = (channel->securityToken).channelId;
          uVar6 = local_78->binaryEncodingId;
          *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12aed0;
          UA_LOG_INFO(p_Var8,UA_LOGCATEGORY_SECURECHANNEL,
                      "Connection %i | SecureChannel %i | Service request %i without a valid session"
                      ,uVar19,(ulong)uVar25,(ulong)uVar6);
          pUVar17 = local_38;
          sVar20 = local_40;
          *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12aeec;
          sendError(channel,msg,sVar20,pUVar17,UVar12,0x80250000);
          goto LAB_0012ae66;
        }
        uStack_168 = 0;
        uStack_167 = 0;
        pUStack_178 = (UA_Byte *)0x0;
        uStack_170 = 0;
        local_16f = 0;
        local_188 = (UA_Byte *)0x0;
        sStack_180 = 0;
        local_198._0_4_ = UA_APPLICATIONTYPE_SERVER;
        local_198._4_4_ = 0;
        sStack_190 = 0;
        local_1a8 = 0;
        pUStack_1a0 = (UA_Byte *)0x0;
        local_1b8[0] = 0;
        local_1b8[1] = 0;
        pUStack_1b0 = (UA_Byte *)0x0;
        local_1c8 = 0;
        pUStack_1c0 = (UA_Byte *)0x0;
        local_1d8._0_8_ = 0;
        local_1d8._8_8_ = (UA_Byte *)0x0;
        local_158 = 0;
        pUStack_150 = (UA_Byte *)0x0;
        local_148.namespaceIndex = 0;
        local_148._2_2_ = 0;
        local_148.identifierType = UA_NODEIDTYPE_NUMERIC;
        local_148.identifier.string.length = 0;
        local_148.identifier.string.data = (UA_Byte *)0x0;
        local_118._0_4_ = 0;
        local_118._4_4_ = 0;
        UStack_110 = 0.0;
        local_108 = 0;
        local_f8 = 5;
        local_f0.lh_first = (ContinuationPointEntry *)0x0;
        local_e8 = 0;
        local_e0.lh_first = (UA_Subscription *)0x0;
        pUStack_d8 = (UA_PublishResponseEntry *)0x0;
        local_d0 = &pUStack_d8;
        UStack_130.namespaceIndex = 0;
        UStack_130._2_2_ = 0;
        UStack_130.identifierType = UA_NODEIDTYPE_GUID;
        UStack_130.identifier.string.length = 0;
        UStack_130.identifier.string.data = (UA_Byte *)0x0;
        local_100 = channel;
        session = (UA_Session *)local_1d8;
      }
      else if (((char)local_48 != '\0') && (session->activated == false)) {
        p_Var8 = (local_70->config).logger;
        pUVar9 = session->channel;
        if (pUVar9 == (UA_SecureChannel *)0x0) {
          uVar19 = 0;
          uVar16 = 0;
        }
        else {
          if (pUVar9->connection == (UA_Connection *)0x0) {
            uVar19 = 0;
          }
          else {
            uVar19 = (ulong)(uint)pUVar9->connection->sockfd;
          }
          uVar16 = (ulong)(pUVar9->securityToken).channelId;
        }
        uVar25 = (session->sessionId).identifier.numeric;
        local_60 = (ulong)(session->sessionId).identifier.guid.data2;
        local_48 = (ulong)(session->sessionId).identifier.guid.data3;
        local_58 = (ulong)(session->sessionId).identifier.guid.data4[0];
        local_50 = (code *)(ulong)(session->sessionId).identifier.guid.data4[1];
        ppos = (size_t)(session->sessionId).identifier.guid.data4[2];
        bVar1 = (session->sessionId).identifier.guid.data4[3];
        bVar2 = (session->sessionId).identifier.guid.data4[4];
        bVar3 = (session->sessionId).identifier.guid.data4[5];
        bVar4 = (session->sessionId).identifier.guid.data4[6];
        bVar5 = (session->sessionId).identifier.guid.data4[7];
        response[-1].requestedSessionTimeout = (UA_Double)(ulong)local_78->binaryEncodingId;
        response[-1].clientCertificate.data = (UA_Byte *)(ulong)bVar5;
        response[-1].clientCertificate.length = (ulong)bVar4;
        response[-1].clientNonce.data = (UA_Byte *)(ulong)bVar3;
        response[-1].clientNonce.length = (ulong)bVar2;
        response[-1].sessionName.data = (UA_Byte *)(ulong)bVar1;
        response[-1].sessionName.length = ppos;
        response[-1].endpointUrl.data = (UA_Byte *)local_50;
        response[-1].endpointUrl.length = local_58;
        response[-1].serverUri.data = (UA_Byte *)local_48;
        response[-1].serverUri.length = local_60;
        response[-1].clientDescription.discoveryUrls = (UA_String *)0x12afca;
        UA_LOG_INFO(p_Var8,UA_LOGCATEGORY_SESSION,
                    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Calling service %i on a non-activated session"
                    ,uVar19,uVar16,(ulong)uVar25);
        pUVar23 = local_38;
        sVar20 = local_40;
        UVar12 = local_64;
        *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12afeb;
        sendError(channel,msg,sVar20,pUVar23,UVar12,0x80270000);
        pUVar24 = &local_70->sessionManager;
        *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12b002;
        UA_SessionManager_removeSession(pUVar24,&session->authenticationToken);
        pUVar23 = local_78;
        goto LAB_0012ae66;
      }
      if (session->channel != channel) {
        UVar15 = 0x80220000;
        goto LAB_0012ae5a;
      }
      *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12ae78;
      UA_Session_updateLifetime(session);
      pcVar13 = local_50;
      UVar12 = local_64;
      pUVar11 = local_70;
      response_00 = (UA_CreateSessionRequest *)ppos;
      if ((char)local_58 != '\0') {
        *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12ae90;
        Service_Publish(pUVar11,session,(UA_PublishRequest *)request,UVar12);
        pUVar23 = local_78;
        goto LAB_0012ae66;
      }
      *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12aea6;
      (*pcVar13)(pUVar11,session,request,response_00);
    }
    else {
      if (session == (UA_Session *)0x0) {
        UVar15 = 0x80250000;
LAB_0012ae5a:
        *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12ae5f;
        sendError(channel,msg,sVar20,pUVar17,UVar12,UVar15);
        pUVar23 = local_78;
        goto LAB_0012ae66;
      }
      *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12ac2e;
      Service_ActivateSession
                (pUVar11,channel,session,(UA_ActivateSessionRequest *)request,
                 (UA_ActivateSessionResponse *)response_00);
    }
  }
  else {
    *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12abb6;
    Service_CreateSession(pUVar11,channel,request,(UA_CreateSessionResponse *)response);
    response_00 = response;
  }
  (response_00->requestHeader).authenticationToken.identifier.numeric =
       *(UA_UInt32 *)((long)local_1b8 + lVar18);
  uVar25 = 0;
  *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12ac4d;
  gettimeofday((timeval *)local_c8,(__timezone_ptr_t)0x0);
  *(long *)&(response_00->requestHeader).authenticationToken =
       (long)local_c8 * 10000000 + tv.tv_sec * 10 + 0x19db1ded53e8000;
  pUVar23 = local_38;
  UVar12 = local_64;
  *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12ac87;
  UVar15 = UA_SecureChannel_sendBinaryMessage(channel,UVar12,response_00,pUVar23);
  if (UVar15 != 0) {
    if (channel->connection != (UA_Connection *)0x0) {
      uVar25 = channel->connection->sockfd;
    }
    p_Var8 = (local_70->config).logger;
    uVar7 = (channel->securityToken).channelId;
    lVar21 = 0;
    lVar18 = 0x141ba0;
    do {
      if (*(UA_StatusCode *)((long)&statusCodeDescriptions[0].code + lVar21) == UVar15) {
        lVar18 = (long)&statusCodeDescriptions[0].code + lVar21;
        break;
      }
      lVar21 = lVar21 + 0x18;
    } while (lVar21 != 0x1578);
    uVar10 = *(undefined8 *)(lVar18 + 8);
    *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12ad47;
    UA_LOG_INFO(p_Var8,UA_LOGCATEGORY_SECURECHANNEL,
                "Connection %i | SecureChannel %i | Could not send the message over the SecureChannel with StatusCode %s"
                ,(ulong)uVar25,(ulong)uVar7,uVar10);
  }
  pUVar23 = local_78;
  *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12ad56;
  deleteMembers_noInit(request,pUVar23);
  uVar6 = pUVar23->memSize;
  *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12ad64;
  memset(request,0,(ulong)uVar6);
  pUVar23 = local_38;
  request = response_00;
LAB_0012ae66:
  *(undefined8 *)&response[-1].maxResponseMessageSize = 0x12ae6b;
  deleteMembers_noInit(request,pUVar23);
  return;
}

Assistant:

static void
processMSG(UA_Server *server, UA_SecureChannel *channel,
           UA_UInt32 requestId, const UA_ByteString *msg) {
    /* At 0, the nodeid starts... */
    size_t ppos = 0;
    size_t *offset = &ppos;

    /* Decode the nodeid */
    UA_NodeId requestTypeId;
    UA_StatusCode retval = UA_NodeId_decodeBinary(msg, offset, &requestTypeId);
    if(retval != UA_STATUSCODE_GOOD)
        return;
    if(requestTypeId.identifierType != UA_NODEIDTYPE_NUMERIC)
        UA_NodeId_deleteMembers(&requestTypeId); /* leads to badserviceunsupported */

    /* Store the start-position of the request */
    size_t requestPos = *offset;

    /* Get the service pointers */
    UA_Service service = NULL;
    const UA_DataType *requestType = NULL;
    const UA_DataType *responseType = NULL;
    UA_Boolean sessionRequired = true;
    getServicePointers(requestTypeId.identifier.numeric, &requestType,
                       &responseType, &service, &sessionRequired);
    if(!requestType) {
        if(requestTypeId.identifier.numeric == 787) {
            UA_LOG_INFO_CHANNEL(server->config.logger, channel,
                                "Client requested a subscription, " \
                                "but those are not enabled in the build");
        } else {
            UA_LOG_INFO_CHANNEL(server->config.logger, channel,
                                "Unknown request with type identifier %i",
                                requestTypeId.identifier.numeric);
        }
        sendError(channel, msg, requestPos, &UA_TYPES[UA_TYPES_SERVICEFAULT],
                  requestId, UA_STATUSCODE_BADSERVICEUNSUPPORTED);
        return;
    }
    UA_assert(responseType);

#ifdef UA_ENABLE_NONSTANDARD_STATELESS
    /* Stateless extension: Sessions are optional */
    sessionRequired = false;
#endif

    /* Decode the request */
    void *request = UA_alloca(requestType->memSize);
    UA_RequestHeader *requestHeader = (UA_RequestHeader*)request;
    retval = UA_decodeBinary(msg, offset, request, requestType);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_DEBUG_CHANNEL(server->config.logger, channel,
                             "Could not decode the request");
        sendError(channel, msg, requestPos, responseType, requestId, retval);
        return;
    }

    /* Prepare the respone */
    void *response = UA_alloca(responseType->memSize);
    UA_init(response, responseType);
    UA_Session *session = NULL; /* must be initialized before goto send_response */

    /* CreateSession doesn't need a session */
    if(requestType == &UA_TYPES[UA_TYPES_CREATESESSIONREQUEST]) {
        Service_CreateSession(server, channel, request, response);
        goto send_response;
    }

    /* Find the matching session */
    session = UA_SecureChannel_getSession(channel, &requestHeader->authenticationToken);
    if(!session)
        session = UA_SessionManager_getSession(&server->sessionManager,
                                               &requestHeader->authenticationToken);

    if(requestType == &UA_TYPES[UA_TYPES_ACTIVATESESSIONREQUEST]) {
        if(!session) {
            UA_LOG_DEBUG_CHANNEL(server->config.logger, channel,
                                 "Trying to activate a session that is " \
                                 "not known in the server");
            sendError(channel, msg, requestPos, responseType,
                      requestId, UA_STATUSCODE_BADSESSIONIDINVALID);
            UA_deleteMembers(request, requestType);
            return;
        }
        Service_ActivateSession(server, channel, session, request, response);
        goto send_response;
    }

    /* Set an anonymous, inactive session for services that need no session */
    UA_Session anonymousSession;
    if(!session) {
        if(sessionRequired) {
            UA_LOG_INFO_CHANNEL(server->config.logger, channel,
                                "Service request %i without a valid session",
                                requestType->binaryEncodingId);
            sendError(channel, msg, requestPos, responseType,
                      requestId, UA_STATUSCODE_BADSESSIONIDINVALID);
            UA_deleteMembers(request, requestType);
            return;
        }
        UA_Session_init(&anonymousSession);
        anonymousSession.sessionId = UA_NODEID_GUID(0, UA_GUID_NULL);
        anonymousSession.channel = channel;
        session = &anonymousSession;
    }

    /* Trying to use a non-activated session? */
    if(sessionRequired && !session->activated) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "Calling service %i on a non-activated session",
                            requestType->binaryEncodingId);
        sendError(channel, msg, requestPos, responseType,
                  requestId, UA_STATUSCODE_BADSESSIONNOTACTIVATED);
        UA_SessionManager_removeSession(&server->sessionManager,
                                        &session->authenticationToken);
        UA_deleteMembers(request, requestType);
        return;
    }

    /* The session is bound to another channel */
    if(session->channel != channel) {
        UA_LOG_DEBUG_CHANNEL(server->config.logger, channel,
                             "Client tries to use an obsolete securechannel");
        sendError(channel, msg, requestPos, responseType,
                  requestId, UA_STATUSCODE_BADSECURECHANNELIDINVALID);
        UA_deleteMembers(request, requestType);
        return;
    }

    /* Update the session lifetime */
    UA_Session_updateLifetime(session);

#ifdef UA_ENABLE_SUBSCRIPTIONS
    /* The publish request is not answered immediately */
    if(requestType == &UA_TYPES[UA_TYPES_PUBLISHREQUEST]) {
        Service_Publish(server, session, request, requestId);
        UA_deleteMembers(request, requestType);
        return;
    }
#endif

    /* Call the service */
    UA_assert(service); /* For all services besides publish, the service pointer is non-NULL*/
    service(server, session, request, response);

 send_response:
    /* Send the response */
    ((UA_ResponseHeader*)response)->requestHandle = requestHeader->requestHandle;
    ((UA_ResponseHeader*)response)->timestamp = UA_DateTime_now();
    retval = UA_SecureChannel_sendBinaryMessage(channel, requestId, response, responseType);

    if(retval != UA_STATUSCODE_GOOD)
        UA_LOG_INFO_CHANNEL(server->config.logger, channel,
                            "Could not send the message over the SecureChannel "
                            "with StatusCode %s", UA_StatusCode_name(retval));

    /* Clean up */
    UA_deleteMembers(request, requestType);
    UA_deleteMembers(response, responseType);
}